

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O0

int Pdr_ManExtendOne(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vUndo,Vec_Int_t *vVis)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj_00;
  int local_78;
  int Value2;
  int Value;
  int iFanout;
  int k;
  int i;
  Aig_Obj_t *pFanout;
  Vec_Int_t *vVis_local;
  Vec_Int_t *vUndo_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  
  Value2 = -1;
  iVar2 = Saig_ObjIsLo(pAig,pObj);
  if (iVar2 == 0) {
    __assert_fail("Saig_ObjIsLo(pAig, pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                  ,0xcb,"int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar2 = Aig_ObjIsTravIdCurrent(pAig,pObj);
  if (iVar2 == 0) {
    __assert_fail("Aig_ObjIsTravIdCurrent(pAig, pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                  ,0xcc,"int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar2 = Pdr_ManSimInfoGet(pAig,pObj);
  if ((iVar2 != 1) && (iVar2 != 2)) {
    __assert_fail("Value == PDR_ZER || Value == PDR_ONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                  ,0xcf,"int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar3 = Aig_ObjId(pObj);
  Vec_IntPush(vUndo,iVar3);
  Vec_IntPush(vUndo,iVar2);
  Pdr_ManSimInfoSet(pAig,pObj,3);
  Vec_IntClear(vVis);
  iVar2 = Aig_ObjId(pObj);
  Vec_IntPush(vVis,iVar2);
  iFanout = 0;
  do {
    iVar2 = Vec_IntSize(vVis);
    if (iVar2 <= iFanout) {
      return 1;
    }
    iVar2 = Vec_IntEntry(vVis,iFanout);
    pObj_00 = Aig_ManObj(pAig,iVar2);
    if (pAig->pFanData == (int *)0x0) {
      __assert_fail("pAig->pFanData",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                    ,0xd9,"int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    Value = 0;
    while( true ) {
      bVar1 = false;
      if (Value < (int)((uint)(*(ulong *)&pObj_00->field_0x18 >> 6) & 0x3ffffff)) {
        if (Value == 0) {
          local_78 = Aig_ObjFanout0Int(pAig,pObj_00->Id);
        }
        else {
          local_78 = Aig_ObjFanoutNext(pAig,Value2);
        }
        Value2 = local_78;
        _k = Aig_ManObj(pAig,local_78 >> 1);
        bVar1 = true;
      }
      if (!bVar1) break;
      iVar2 = Aig_ObjIsTravIdCurrent(pAig,_k);
      if (iVar2 != 0) {
        iVar2 = Aig_ObjId(pObj_00);
        iVar3 = Aig_ObjId(_k);
        if (iVar3 <= iVar2) {
          __assert_fail("Aig_ObjId(pObj) < Aig_ObjId(pFanout)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                        ,0xdd,
                        "int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        iVar2 = Pdr_ManSimInfoGet(pAig,_k);
        if ((iVar2 != 3) && (iVar3 = Pdr_ManExtendOneEval(pAig,_k), iVar3 != iVar2)) {
          if (iVar3 != 3) {
            __assert_fail("Value2 == PDR_UND",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                          ,0xe4,
                          "int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          iVar3 = Aig_ObjId(_k);
          Vec_IntPush(vUndo,iVar3);
          Vec_IntPush(vUndo,iVar2);
          iVar2 = Aig_ObjIsCo(_k);
          if (iVar2 != 0) {
            return 0;
          }
          iVar2 = Aig_ObjIsNode(_k);
          if (iVar2 == 0) {
            __assert_fail("Aig_ObjIsNode(pFanout)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrTsim.c"
                          ,0xe9,
                          "int Pdr_ManExtendOne(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          iVar2 = Aig_ObjId(_k);
          Vec_IntPushOrder(vVis,iVar2);
        }
      }
      Value = Value + 1;
    }
    iFanout = iFanout + 1;
  } while( true );
}

Assistant:

int Pdr_ManExtendOne( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vUndo, Vec_Int_t * vVis )
{
    Aig_Obj_t * pFanout;
    int i, k, iFanout = -1, Value, Value2;
    assert( Saig_ObjIsLo(pAig, pObj) );
    assert( Aig_ObjIsTravIdCurrent(pAig, pObj) );
    // save original value
    Value = Pdr_ManSimInfoGet( pAig, pObj );
    assert( Value == PDR_ZER || Value == PDR_ONE );
    Vec_IntPush( vUndo, Aig_ObjId(pObj) );
    Vec_IntPush( vUndo, Value );
    // update original value
    Pdr_ManSimInfoSet( pAig, pObj, PDR_UND );
    // traverse
    Vec_IntClear( vVis );
    Vec_IntPush( vVis, Aig_ObjId(pObj) );
    Aig_ManForEachObjVec( vVis, pAig, pObj, i )
    {
        Aig_ObjForEachFanout( pAig, pObj, pFanout, iFanout, k )
        {
            if ( !Aig_ObjIsTravIdCurrent(pAig, pFanout) )
                continue;
            assert( Aig_ObjId(pObj) < Aig_ObjId(pFanout) );
            Value = Pdr_ManSimInfoGet( pAig, pFanout );
            if ( Value == PDR_UND )
                continue;
            Value2 = Pdr_ManExtendOneEval( pAig, pFanout );
            if ( Value2 == Value )
                continue;
            assert( Value2 == PDR_UND );
            Vec_IntPush( vUndo, Aig_ObjId(pFanout) );
            Vec_IntPush( vUndo, Value );
            if ( Aig_ObjIsCo(pFanout) )
                return 0;
            assert( Aig_ObjIsNode(pFanout) );
            Vec_IntPushOrder( vVis, Aig_ObjId(pFanout) );
        }
    }
    return 1;
}